

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecisionTuner.cpp
# Opt level: O1

double __thiscall
PrecisionTuner::__overloading_function
          (PrecisionTuner *this,vector<void_*,_std::allocator<void_*>_> *btVec,string *s,float fres,
          double dres,double value,string *label,double timeStamp)

{
  Profile *pPVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  double dVar6;
  ShadowValue shadowValue;
  double local_f0;
  string local_a0;
  string local_80;
  ShadowValue local_60;
  
  if (DebugFlag) {
    bVar3 = isCurrentDebugType("info");
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"STARTING ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"__overloading_function",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
    }
  }
  if (this->__mode == APPLYING_PROF) {
    ShadowValue::ShadowValue(&local_60,(double)fres,(float)dres,value,false,timeStamp);
    pPVar1 = this->__profile;
    pcVar2 = (label->_M_dataplus)._M_p;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar2,pcVar2 + label->_M_string_length);
    Profile::applyProfiling(pPVar1,btVec,&local_a0,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    bVar3 = false;
  }
  else {
    if (this->__mode != APPLYING_STRAT) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"PrecisionTuner ERROR: no __mode chosen");
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(-1);
    }
    pPVar1 = this->__profile;
    pcVar2 = (label->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + label->_M_string_length);
    bVar3 = Profile::applyStrategy(pPVar1,btVec,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (DebugFlag == true) {
    bVar4 = isCurrentDebugType("fperror");
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"SINGLE precision? ",0x12);
      poVar5 = std::ostream::_M_insert<bool>(true);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  local_f0 = (double)fres;
  if (DebugFlag == true) {
    bVar4 = isCurrentDebugType("fperrorplus");
    if (bVar4) {
      *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 0x10;
      if (bVar3 == false) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(s->_M_dataplus)._M_p,s->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," dres=",6);
        dVar6 = dres;
      }
      else {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(s->_M_dataplus)._M_p,s->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," dres=",6);
        poVar5 = std::ostream::_M_insert<double>(dres);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," fres=",6);
        poVar5 = std::ostream::_M_insert<double>(local_f0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," AbsError: ",0xb);
        poVar5 = std::ostream::_M_insert<double>(ABS(local_f0 - dres));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," RelError: ",0xb);
        dVar6 = ABS((local_f0 - dres) / dres);
      }
      poVar5 = std::ostream::_M_insert<double>(dVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," value=",7);
      poVar5 = std::ostream::_M_insert<double>(value);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  if (DebugFlag == true) {
    bVar4 = isCurrentDebugType("fperror");
    if (bVar4) {
      *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 0x10;
      if (bVar3 == false) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(s->_M_dataplus)._M_p,s->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," in double precision.",0x15);
      }
      else {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(s->_M_dataplus)._M_p,s->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," RelError: ",0xb);
        poVar5 = std::ostream::_M_insert<double>(ABS((local_f0 - dres) / dres));
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  if (DebugFlag == true) {
    bVar4 = isCurrentDebugType("info");
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ENDING ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"__overloading_function",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
    }
  }
  if (bVar3 == false) {
    local_f0 = dres;
  }
  return local_f0;
}

Assistant:

double PrecisionTuner::__overloading_function(vector<void*> &btVec, string s,
        float fres, double dres, double value, string label, double timeStamp){
    bool singlePrecision, singlePrecisionProfiling;
    double res;
#ifdef NDEBUG
    UNUSED(s);
    UNUSED(value);
#endif
    DEBUG("info",cerr << "STARTING " << __FUNCTION__ << endl;);
    singlePrecisionProfiling = false;
    singlePrecision = false;
    switch(__mode){
        case APPLYING_STRAT:
            singlePrecision = __profile->applyStrategy(btVec, label);
            break;
        case APPLYING_PROF:
            {
                ShadowValue shadowValue(fres, dres, value, singlePrecisionProfiling, timeStamp);
                __profile->applyProfiling(btVec, label, shadowValue);
            }
            break;
        default:
            {
                cerr << "PrecisionTuner ERROR: no __mode chosen" << endl;
                exit(-1);
            }
            break;
    }
    res = singlePrecision ? (double) fres : dres;
    DEBUG("fperror", cerr << "SINGLE precision? " << singlePrecision << endl; );
    DEBUG("fperrorplus", cerr << std::setprecision(16) ; double relErr = fabs(fres - dres) / fabs(dres); if(singlePrecision)  cerr << s << " dres=" << dres << " fres=" << fres << " AbsError: " << fabs(fres - dres)<<" RelError: " << relErr << " value=" << value <<endl; else cerr << s << " dres=" << dres<< " value=" << value << endl;);
    DEBUG("fperror", cerr << std::setprecision(16) ; double relErr = fabs(fres - dres) / fabs(dres); if(singlePrecision)  cerr << s << " RelError: " << relErr  <<endl; else cerr << s << " in double precision." << endl;);
    DEBUG("info",cerr << "ENDING " << __FUNCTION__ << endl;);
    return res;
}